

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void el::Loggers::setDefaultConfigurations
               (Configurations *configurations,bool reconfigureExistingLoggers)

{
  undefined7 in_register_00000031;
  
  base::RegisteredLoggers::setDefaultConfigurations
            (*(RegisteredLoggers **)(base::elStorage + 0x10),configurations);
  if ((int)CONCAT71(in_register_00000031,reconfigureExistingLoggers) != 0) {
    reconfigureAllLoggers(configurations);
    return;
  }
  return;
}

Assistant:

void Loggers::setDefaultConfigurations(const Configurations& configurations, bool reconfigureExistingLoggers) {
  ELPP->registeredLoggers()->setDefaultConfigurations(configurations);
  if (reconfigureExistingLoggers) {
    Loggers::reconfigureAllLoggers(configurations);
  }
}